

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

uint Abc_TtSemiCanonicize(word *pTruth,int nVars,char *pCanonPerm,int *pStoreOut,int fOnlySwap)

{
  char cVar1;
  undefined4 uVar2;
  bool bVar3;
  int nWords_00;
  byte bVar4;
  int **local_b8;
  int t_3;
  int t_2;
  int BestK;
  int k;
  int t_1;
  int t;
  int fChange;
  uint uCanonPhase;
  int nWords;
  int nOnes;
  int i;
  int *pStore;
  int pStoreIn [17];
  int fOldSwap;
  int fUseOld;
  int fOnlySwap_local;
  int *pStoreOut_local;
  char *pCanonPerm_local;
  int nVars_local;
  word *pTruth_local;
  
  pStoreIn[0x10] = 1;
  pStoreIn[0xf] = 0;
  local_b8 = (int **)pStoreOut;
  if (pStoreOut == (int *)0x0) {
    local_b8 = &pStore;
  }
  nWords_00 = Abc_TtWordNum(nVars);
  t = 0;
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                  ,0x24e,"unsigned int Abc_TtSemiCanonicize(word *, int, char *, int *, int)");
  }
  for (nWords = 0; nWords < nVars; nWords = nWords + 1) {
    pCanonPerm[nWords] = (char)nWords;
  }
  if (pStoreIn[0x10] == 0) {
    uCanonPhase = Abc_TtCountOnesInCofsQuick(pTruth,nVars,(int *)local_b8);
    if ((nWords_00 * 0x20 < (int)uCanonPhase) && (fOnlySwap == 0)) {
      for (nWords = 0; nWords < nVars; nWords = nWords + 1) {
        *(int *)((long)local_b8 + (long)nWords * 4) =
             nWords_00 * 0x20 - *(int *)((long)local_b8 + (long)nWords * 4);
      }
      Abc_TtNot(pTruth,nWords_00);
      uCanonPhase = nWords_00 * 0x40 - uCanonPhase;
      t = 1 << ((byte)nVars & 0x1f);
    }
    *(uint *)((long)local_b8 + (long)nVars * 4) = uCanonPhase;
    for (nWords = 0; nWords < nVars; nWords = nWords + 1) {
      if ((*(int *)((long)local_b8 + (long)nWords * 4) <
           (int)(uCanonPhase - *(int *)((long)local_b8 + (long)nWords * 4))) && (fOnlySwap == 0)) {
        Abc_TtFlip(pTruth,nWords_00,nWords);
        t = 1 << ((byte)nWords & 0x1f) | t;
        *(uint *)((long)local_b8 + (long)nWords * 4) =
             uCanonPhase - *(int *)((long)local_b8 + (long)nWords * 4);
      }
    }
  }
  else {
    uCanonPhase = Abc_TtCountOnesInTruth(pTruth,nVars);
    if ((nWords_00 * 0x20 < (int)uCanonPhase) && (fOnlySwap == 0)) {
      Abc_TtNot(pTruth,nWords_00);
      uCanonPhase = nWords_00 * 0x40 - uCanonPhase;
      t = 1 << ((byte)nVars & 0x1f);
    }
    Abc_TtCountOnesInCofs(pTruth,nVars,(int *)local_b8);
    *(uint *)((long)local_b8 + (long)nVars * 4) = uCanonPhase;
    for (nWords = 0; nWords < nVars; nWords = nWords + 1) {
      if ((*(int *)((long)local_b8 + (long)nWords * 4) <
           (int)(uCanonPhase - *(int *)((long)local_b8 + (long)nWords * 4))) && (fOnlySwap == 0)) {
        Abc_TtFlip(pTruth,nWords_00,nWords);
        t = 1 << ((byte)nWords & 0x1f) | t;
        *(uint *)((long)local_b8 + (long)nWords * 4) =
             uCanonPhase - *(int *)((long)local_b8 + (long)nWords * 4);
      }
    }
  }
  if (pStoreIn[0xf] == 0) {
    for (nWords = 0; nWords < nVars + -1; nWords = nWords + 1) {
      t_3 = nWords + 1;
      for (t_2 = nWords + 2; t_2 < nVars; t_2 = t_2 + 1) {
        if (*(int *)((long)local_b8 + (long)t_2 * 4) < *(int *)((long)local_b8 + (long)t_3 * 4)) {
          t_3 = t_2;
        }
      }
      if (*(int *)((long)local_b8 + (long)t_3 * 4) < *(int *)((long)local_b8 + (long)nWords * 4)) {
        cVar1 = pCanonPerm[nWords];
        pCanonPerm[nWords] = pCanonPerm[t_3];
        pCanonPerm[t_3] = cVar1;
        uVar2 = *(undefined4 *)((long)local_b8 + (long)nWords * 4);
        *(undefined4 *)((long)local_b8 + (long)nWords * 4) =
             *(undefined4 *)((long)local_b8 + (long)t_3 * 4);
        *(undefined4 *)((long)local_b8 + (long)t_3 * 4) = uVar2;
        if (((uint)t >> ((byte)nWords & 0x1f) & 1) != ((uint)t >> ((byte)t_3 & 0x1f) & 1)) {
          t = 1 << ((byte)t_3 & 0x1f) ^ 1 << ((byte)nWords & 0x1f) ^ t;
        }
        Abc_TtSwapVars(pTruth,nVars,nWords,t_3);
      }
    }
  }
  else {
    do {
      bVar3 = false;
      for (nWords = 0; nWords < nVars + -1; nWords = nWords + 1) {
        if (*(int *)((long)local_b8 + (long)(nWords + 1) * 4) <
            *(int *)((long)local_b8 + (long)nWords * 4)) {
          cVar1 = pCanonPerm[nWords];
          pCanonPerm[nWords] = pCanonPerm[nWords + 1];
          pCanonPerm[nWords + 1] = cVar1;
          uVar2 = *(undefined4 *)((long)local_b8 + (long)nWords * 4);
          *(undefined4 *)((long)local_b8 + (long)nWords * 4) =
               *(undefined4 *)((long)local_b8 + (long)(nWords + 1) * 4);
          *(undefined4 *)((long)local_b8 + (long)(nWords + 1) * 4) = uVar2;
          bVar4 = (byte)nWords;
          if (((uint)t >> (bVar4 & 0x1f) & 1) != ((uint)t >> (bVar4 + 1 & 0x1f) & 1)) {
            t = 1 << (bVar4 + 1 & 0x1f) ^ 1 << (bVar4 & 0x1f) ^ t;
          }
          Abc_TtSwapAdjacent(pTruth,nWords_00,nWords);
          bVar3 = true;
        }
      }
    } while (bVar3);
  }
  return t;
}

Assistant:

static inline unsigned Abc_TtSemiCanonicize( word * pTruth, int nVars, char * pCanonPerm, int * pStoreOut, int fOnlySwap )
{
    int fUseOld = 1;
    int fOldSwap = 0;
    int pStoreIn[17];
    int * pStore = pStoreOut ? pStoreOut : pStoreIn;
    int i, nOnes, nWords = Abc_TtWordNum( nVars );
    unsigned uCanonPhase = 0;
    assert( nVars <= 16 );
    for ( i = 0; i < nVars; i++ )
        pCanonPerm[i] = i;

    if ( fUseOld )
    {
        // normalize polarity    
        nOnes = Abc_TtCountOnesInTruth( pTruth, nVars );
        if ( nOnes > nWords * 32 && !fOnlySwap )
        {
            Abc_TtNot( pTruth, nWords );
            nOnes = nWords*64 - nOnes;
            uCanonPhase |= (1 << nVars);
        }
        // normalize phase
        Abc_TtCountOnesInCofs( pTruth, nVars, pStore );
        pStore[nVars] = nOnes;
        for ( i = 0; i < nVars; i++ )
        {
            if ( pStore[i] >= nOnes - pStore[i] || fOnlySwap )
                continue;
            Abc_TtFlip( pTruth, nWords, i );
            uCanonPhase |= (1 << i);
            pStore[i] = nOnes - pStore[i]; 
        }
    }
    else
    {
        nOnes = Abc_TtCountOnesInCofsQuick( pTruth, nVars, pStore );
        // normalize polarity    
        if ( nOnes > nWords * 32 && !fOnlySwap )
        {
            for ( i = 0; i < nVars; i++ )
                pStore[i] = nWords * 32 - pStore[i]; 
            Abc_TtNot( pTruth, nWords );
            nOnes = nWords*64 - nOnes;
            uCanonPhase |= (1 << nVars);
        }
        // normalize phase
        pStore[nVars] = nOnes;
        for ( i = 0; i < nVars; i++ )
        {
            if ( pStore[i] >= nOnes - pStore[i] || fOnlySwap )
                continue;
            Abc_TtFlip( pTruth, nWords, i );
            uCanonPhase |= (1 << i);
            pStore[i] = nOnes - pStore[i]; 
        }
    }

    // normalize permutation
    if ( fOldSwap )
    {
        int fChange;
        do {
            fChange = 0;
            for ( i = 0; i < nVars-1; i++ )
            {
                if ( pStore[i] <= pStore[i+1] )
    //            if ( pStore[i] >= pStore[i+1] )
                    continue;
                ABC_SWAP( int, pCanonPerm[i], pCanonPerm[i+1] );
                ABC_SWAP( int, pStore[i], pStore[i+1] );
                if ( ((uCanonPhase >> i) & 1) != ((uCanonPhase >> (i+1)) & 1) )
                {
                    uCanonPhase ^= (1 << i);
                    uCanonPhase ^= (1 << (i+1));
                }
                Abc_TtSwapAdjacent( pTruth, nWords, i );            
                fChange = 1;
    //            nSwaps++;
            }
        } 
        while ( fChange );
    }
    else
    {
        int k, BestK;
        for ( i = 0; i < nVars - 1; i++ )
        {
            BestK = i + 1;
            for ( k = i + 2; k < nVars; k++ )
                if ( pStore[BestK] > pStore[k] )
    //            if ( pStore[BestK] < pStore[k] )
                    BestK = k;
            if ( pStore[i] <= pStore[BestK] )
    //        if ( pStore[i] >= pStore[BestK] )
                continue;
            ABC_SWAP( int, pCanonPerm[i], pCanonPerm[BestK] );
            ABC_SWAP( int, pStore[i], pStore[BestK] );
            if ( ((uCanonPhase >> i) & 1) != ((uCanonPhase >> BestK) & 1) )
            {
                uCanonPhase ^= (1 << i);
                uCanonPhase ^= (1 << BestK);
            }
            Abc_TtSwapVars( pTruth, nVars, i, BestK );
    //        nSwaps++;
        }
    }
    return uCanonPhase;
}